

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O1

void uavs3d_if_hor_ver_chroma
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff_h,s8 *coeff_v,
               int max_val)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  sbyte sVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  undefined1 *puVar17;
  long lVar18;
  sbyte sVar19;
  undefined1 *puVar20;
  pel *ppVar21;
  undefined1 *puVar22;
  undefined1 *puVar23;
  bool bVar24;
  undefined1 local_4338 [2];
  undefined1 local_4336 [17158];
  
  sVar10 = (max_val != 0xff) * '\x02';
  cVar1 = (max_val == 0xff) * '\x02';
  sVar19 = cVar1 + 10;
  iVar13 = 1 << cVar1 + 9;
  ppVar21 = src + -i_src;
  lVar12 = (long)width;
  if (max_val == 0xff) {
    if (-3 < height) {
      puVar17 = local_4338;
      iVar11 = -1;
      do {
        if (0 < width) {
          cVar1 = *coeff_h;
          cVar2 = coeff_h[1];
          cVar3 = coeff_h[2];
          cVar4 = coeff_h[3];
          lVar15 = 0;
          do {
            *(ushort *)(puVar17 + lVar15 * 2) =
                 (ushort)ppVar21[lVar15 + 4] * (short)cVar4 +
                 (ushort)ppVar21[lVar15 + 2] * (short)cVar3 +
                 (ushort)ppVar21[lVar15] * (short)cVar2 +
                 (ushort)ppVar21[lVar15 + -2] * (short)cVar1;
            *(ushort *)(puVar17 + lVar15 * 2 + 2) =
                 (ushort)ppVar21[lVar15 + 5] * (short)cVar4 +
                 (ushort)ppVar21[lVar15 + 3] * (short)cVar3 +
                 (ushort)ppVar21[lVar15 + 1] * (short)cVar2 +
                 (ushort)ppVar21[lVar15 + -1] * (short)cVar1;
            lVar15 = lVar15 + 2;
          } while (lVar15 < lVar12);
        }
        ppVar21 = ppVar21 + i_src;
        puVar17 = puVar17 + lVar12 * 2;
        bVar24 = iVar11 != height + 1;
        iVar11 = iVar11 + 1;
      } while (bVar24);
    }
  }
  else if (-3 < height) {
    uVar9 = (uint)(1 << sVar10) >> 1;
    puVar17 = local_4338;
    iVar11 = -1;
    do {
      if (0 < width) {
        cVar1 = *coeff_h;
        cVar2 = coeff_h[1];
        cVar3 = coeff_h[2];
        cVar4 = coeff_h[3];
        lVar15 = 0;
        do {
          bVar5 = ppVar21[lVar15 + -1];
          bVar6 = ppVar21[lVar15 + 1];
          bVar7 = ppVar21[lVar15 + 3];
          bVar8 = ppVar21[lVar15 + 5];
          *(short *)(puVar17 + lVar15 * 2) =
               (short)((int)((uint)ppVar21[lVar15 + -2] * (int)cVar1 + uVar9 +
                             (uint)ppVar21[lVar15 + 2] * (int)cVar3 +
                             (uint)ppVar21[lVar15] * (int)cVar2 +
                            (uint)ppVar21[lVar15 + 4] * (int)cVar4) >> sVar10);
          *(short *)(puVar17 + lVar15 * 2 + 2) =
               (short)((int)((uint)bVar5 * (int)cVar1 + uVar9 +
                             (uint)bVar7 * (int)cVar3 + (uint)bVar6 * (int)cVar2 +
                            (uint)bVar8 * (int)cVar4) >> sVar10);
          lVar15 = lVar15 + 2;
        } while (lVar15 < lVar12);
      }
      ppVar21 = ppVar21 + i_src;
      puVar17 = puVar17 + lVar12 * 2;
      bVar24 = iVar11 != height + 1;
      iVar11 = iVar11 + 1;
    } while (bVar24);
  }
  if (0 < height) {
    lVar15 = lVar12 * 2;
    puVar22 = local_4336 + (long)(width * 2) * 2 + lVar12 * 2;
    puVar23 = local_4336 + lVar12 * 4;
    puVar20 = local_4336 + lVar12 * 2;
    iVar11 = 0;
    puVar17 = local_4338;
    do {
      if (0 < width) {
        lVar18 = 0;
        do {
          iVar14 = (int)*(short *)(puVar17 + lVar18 * 2) * (int)*coeff_v + iVar13 +
                   (int)*(short *)(puVar23 + lVar18 * 2 + -2) * (int)coeff_v[2] +
                   (int)*(short *)(puVar20 + lVar18 * 2 + -2) * (int)coeff_v[1] +
                   (int)*(short *)(puVar22 + lVar18 * 2 + -2) * (int)coeff_v[3] >> sVar19;
          iVar16 = (int)*(short *)(puVar17 + lVar18 * 2 + 2) * (int)*coeff_v + iVar13 +
                   (int)*(short *)(puVar23 + lVar18 * 2) * (int)coeff_v[2] +
                   (int)*(short *)(puVar20 + lVar18 * 2) * (int)coeff_v[1] +
                   (int)*(short *)(puVar22 + lVar18 * 2) * (int)coeff_v[3] >> sVar19;
          if (max_val <= iVar14) {
            iVar14 = max_val;
          }
          if (iVar14 < 1) {
            iVar14 = 0;
          }
          dst[lVar18] = (pel)iVar14;
          if (max_val <= iVar16) {
            iVar16 = max_val;
          }
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          dst[lVar18 + 1] = (pel)iVar16;
          lVar18 = lVar18 + 2;
        } while (lVar18 < lVar12);
      }
      dst = dst + i_dst;
      iVar11 = iVar11 + 1;
      puVar22 = puVar22 + lVar15;
      puVar23 = puVar23 + lVar15;
      puVar17 = puVar17 + lVar15;
      puVar20 = puVar20 + lVar15;
    } while (iVar11 != height);
  }
  return;
}

Assistant:

static void uavs3d_if_hor_ver_chroma(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, const s8 *coeff_h, const s8 *coeff_v, int max_val)
{
    int row, col;
    int sumu, sumv, valu, valv;
    int add1, shift1;
    int add2, shift2;

    ALIGNED_16(s16 tmp_res[(64 + 3) * 64 * 2]); // UV interlaced
    s16 *tmp;

    if (max_val == 255) { // 8 bit_depth
        shift1 = 0;
        shift2 = 12;
    }
    else { // 10 bit_depth
        shift1 = 2;
        shift2 = 10;
    }

    add1 = (1 << (shift1)) >> 1;
    add2 = 1 << (shift2 - 1);

    src += -1 * i_src;
    tmp = tmp_res;

    if (shift1) {
        for (row = -1; row < height + 2; row++) {
            for (col = 0; col < width; col += 2) {
                sumu = FLT_4TAP_HOR(src, col, coeff_h);
                sumv = FLT_4TAP_HOR(src, col + 1, coeff_h);
                tmp[col] = (sumu + add1) >> shift1;
                tmp[col + 1] = (sumv + add1) >> shift1;
            }
            src += i_src;
            tmp += width;
        }
    }
    else {
        for (row = -1; row < height + 2; row++) {
            for (col = 0; col < width; col += 2) {
                tmp[col] = FLT_4TAP_HOR(src, col, coeff_h);
                tmp[col + 1] = FLT_4TAP_HOR(src, col + 1, coeff_h);
            }
            src += i_src;
            tmp += width;
        }
    }

    tmp = tmp_res + 1 * width;

    for (row = 0; row < height; row++) {
        for (col = 0; col < width; col += 2) {
            sumu = FLT_4TAP_VER(tmp, col, width, coeff_v);
            sumv = FLT_4TAP_VER(tmp, col + 1, width, coeff_v);
            valu = (sumu + add2) >> shift2;
            valv = (sumv + add2) >> shift2;
            dst[col] = COM_CLIP3(0, max_val, valu);
            dst[col + 1] = COM_CLIP3(0, max_val, valv);
        }
        dst += i_dst;
        tmp += width;
    }
}